

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall matchit::impl::Id<bool>::hasValue(Id<bool> *this)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_bool,_bool_*,_const_bool_*>_&>
  _Var1;
  BlockT *this_00;
  Id<bool> *this_local;
  
  this_00 = block(this);
  _Var1 = IdBlock<bool>::hasValue(this_00);
  return _Var1;
}

Assistant:

constexpr bool hasValue() const { return block().hasValue(); }